

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void inverse_mdct(float *buffer,int n,vorb *f,int blocktype)

{
  undefined8 *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  undefined4 extraout_var;
  float *pfVar7;
  uint uVar8;
  float *pfVar9;
  ushort *puVar10;
  float *pfVar11;
  int iVar12;
  float *pfVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  vorb **ppvVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vorb *local_b8;
  float *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  undefined4 uStack_6c;
  float *local_68;
  undefined8 local_60;
  ulong local_58;
  int a_off;
  int local_4c;
  int local_48;
  undefined4 uStack_44;
  float *local_40;
  uint local_34;
  
  local_34 = n;
  uVar8 = n >> 1;
  local_78 = f->temp_offset;
  local_98 = (ulong)uVar8;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    pfVar6 = (float *)((long)&local_b8 - ((long)(int)uVar8 * 4 + 0xfU & 0xfffffffffffffff0));
    ppvVar17 = (vorb **)pfVar6;
  }
  else {
    pfVar6 = (float *)setup_temp_malloc(f,uVar8 * 4);
    ppvVar17 = &local_b8;
  }
  lVar14 = (long)(int)uVar8;
  pfVar7 = f->A[(uint)blocktype];
  pfVar11 = pfVar6 + (long)(int)uVar8 + -2;
  pfVar9 = pfVar7;
  if (1 < local_34) {
    pfVar13 = buffer;
    do {
      pfVar11[1] = *pfVar13 * *pfVar9 - pfVar9[1] * pfVar13[2];
      *pfVar11 = *pfVar13 * pfVar9[1] + pfVar13[2] * *pfVar9;
      pfVar11 = pfVar11 + -2;
      pfVar9 = pfVar9 + 2;
      pfVar13 = pfVar13 + 4;
    } while (pfVar13 != buffer + lVar14);
  }
  if (pfVar6 <= pfVar11) {
    pfVar13 = buffer + lVar14 + -1;
    do {
      pfVar11[1] = pfVar13[-2] * pfVar9[1] - *pfVar13 * *pfVar9;
      *pfVar11 = -*pfVar13 * pfVar9[1] - *pfVar9 * pfVar13[-2];
      pfVar11 = pfVar11 + -2;
      pfVar9 = pfVar9 + 2;
      pfVar13 = pfVar13 + -4;
    } while (pfVar6 <= pfVar11);
  }
  uVar8 = local_34;
  local_a8 = (ulong)(uint)blocktype;
  local_b8 = f;
  uVar15 = (int)local_34 >> 2;
  local_58 = (ulong)(uint)((int)local_34 >> 3);
  local_88 = lVar14;
  pfVar9 = pfVar7 + lVar14 + -8;
  if (pfVar7 <= pfVar9) {
    lVar14 = (long)(int)uVar15;
    lVar18 = 0;
    do {
      fVar25 = *(float *)((long)pfVar6 + lVar18 + lVar14 * 4 + 4);
      fVar24 = *(float *)((long)pfVar6 + lVar18 + 4);
      fVar23 = *(float *)((long)pfVar6 + lVar18 + lVar14 * 4) - *(float *)((long)pfVar6 + lVar18);
      *(float *)((long)buffer + lVar18 + lVar14 * 4 + 4) = fVar25 + fVar24;
      fVar25 = fVar25 - fVar24;
      *(float *)((long)buffer + lVar18 + lVar14 * 4) =
           *(float *)((long)pfVar6 + lVar18 + lVar14 * 4) + *(float *)((long)pfVar6 + lVar18);
      *(float *)((long)buffer + lVar18 + 4) = pfVar9[4] * fVar25 - pfVar9[5] * fVar23;
      *(float *)((long)buffer + lVar18) = fVar23 * pfVar9[4] + fVar25 * pfVar9[5];
      fVar25 = *(float *)((long)pfVar6 + lVar18 + lVar14 * 4 + 0xc);
      fVar24 = *(float *)((long)pfVar6 + lVar18 + 0xc);
      fVar26 = fVar25 - fVar24;
      fVar23 = *(float *)((long)pfVar6 + lVar18 + lVar14 * 4 + 8) -
               *(float *)((long)pfVar6 + lVar18 + 8);
      *(float *)((long)buffer + lVar18 + lVar14 * 4 + 0xc) = fVar25 + fVar24;
      *(float *)((long)buffer + lVar18 + lVar14 * 4 + 8) =
           *(float *)((long)pfVar6 + lVar18 + lVar14 * 4 + 8) +
           *(float *)((long)pfVar6 + lVar18 + 8);
      *(float *)((long)buffer + lVar18 + 0xc) = *pfVar9 * fVar26 - pfVar9[1] * fVar23;
      *(float *)((long)buffer + lVar18 + 8) = fVar23 * *pfVar9 + fVar26 * pfVar9[1];
      pfVar9 = pfVar9 + -8;
      lVar18 = lVar18 + 0x10;
    } while (pfVar7 <= pfVar9);
  }
  local_b0 = pfVar6;
  local_40 = pfVar7;
  *(float *)((long)ppvVar17 + -8) = 1.670838e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  iVar4 = ilog(uVar8);
  local_60 = CONCAT44(extraout_var,iVar4);
  iVar21 = (int)uVar8 >> 4;
  iVar22 = (int)local_98 + -1;
  iVar16 = (int)local_58;
  local_90 = (ulong)uVar15;
  *(float *)((long)ppvVar17 + -8) = 1.670912e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_iter0_loop(iVar21,buffer,iVar22,-iVar16,pfVar7);
  iVar4 = iVar22 - (int)local_90;
  *(float *)((long)ppvVar17 + -8) = 1.670948e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_iter0_loop(iVar21,buffer,iVar4,-iVar16,pfVar7);
  iVar16 = (int)local_34 >> 5;
  iVar21 = -iVar21;
  *(float *)((long)ppvVar17 + -8) = 1.670995e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar16,buffer,iVar22,iVar21,pfVar7,0x10);
  pfVar6 = local_40;
  iVar4 = (int)local_58;
  *(float *)((long)ppvVar17 + -8) = 1.671041e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar16,buffer,iVar22 - iVar4,iVar21,pfVar6,0x10);
  pfVar6 = local_40;
  *(float *)((long)ppvVar17 + -8) = 1.67109e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar16,buffer,iVar22 + iVar4 * -2,iVar21,pfVar6,0x10);
  iVar4 = (int)local_58;
  local_74 = iVar16;
  local_68 = buffer;
  local_4c = iVar22;
  *(float *)((long)ppvVar17 + -8) = 1.671155e-39;
  *(float *)((long)ppvVar17 + -4) = 0.0;
  imdct_step3_inner_r_loop(iVar16,buffer,iVar22 + iVar4 * -3,iVar21,pfVar6,0x10);
  pfVar7 = local_40;
  pfVar6 = local_68;
  a_off = (int)local_60 + -4 >> 1;
  iVar4 = 2;
  if (2 < a_off) {
    local_a0 = 2;
    do {
      bVar3 = (byte)local_a0;
      iVar4 = (int)local_34 >> (bVar3 + 2 & 0x1f);
      _local_48 = CONCAT44(uStack_44,iVar4);
      iVar16 = 2 << (bVar3 & 0x1f);
      if (0 < iVar16) {
        local_7c = (int)local_34 >> (bVar3 + 4 & 0x1f);
        _local_70 = CONCAT44(uStack_6c,-(iVar4 >> 1));
        iVar4 = local_4c;
        do {
          iVar21 = local_7c;
          iVar22 = local_70;
          *(float *)((long)ppvVar17 + -8) = 1.67135e-39;
          *(float *)((long)ppvVar17 + -4) = 0.0;
          imdct_step3_inner_r_loop(iVar21,pfVar6,iVar4,iVar22,pfVar7,8 << (bVar3 & 0x1f));
          iVar4 = iVar4 - local_48;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      uVar8 = (int)local_a0 + 1;
      local_a0 = (ulong)uVar8;
      iVar4 = a_off;
    } while (uVar8 != a_off);
  }
  iVar16 = (int)local_60 + -7;
  if (iVar4 < iVar16) {
    do {
      bVar3 = (byte)iVar4;
      iVar21 = (int)local_34 >> (bVar3 + 6 & 0x1f);
      iVar22 = 2 << (bVar3 & 0x1f);
      if (0 < iVar21) {
        iVar5 = (int)local_34 >> (bVar3 + 2 & 0x1f);
        lVar18 = (long)(8 << (bVar3 & 0x1f));
        iVar12 = 0x10 << (bVar3 & 0x1f);
        lVar20 = (long)(0x18 << (bVar3 & 0x1f));
        lVar14 = (long)(iVar5 >> 1);
        pfVar7 = local_68 + local_88 + -2;
        pfVar6 = local_40;
        do {
          if (0 < iVar22) {
            fVar25 = pfVar6[lVar20];
            fVar24 = pfVar6[lVar20 + 1];
            fVar23 = pfVar6[iVar12];
            fVar26 = pfVar6[iVar12 + 1];
            fVar36 = pfVar6[lVar18];
            fVar27 = pfVar6[lVar18 + 1];
            fVar28 = *pfVar6;
            fVar29 = pfVar6[1];
            pfVar9 = pfVar7;
            uVar8 = iVar22 + 1;
            do {
              fVar30 = (float)*(undefined8 *)pfVar9;
              fVar31 = (float)((ulong)*(undefined8 *)pfVar9 >> 0x20);
              fVar41 = fVar30 - (float)*(undefined8 *)(pfVar9 + -lVar14);
              fVar32 = (float)((ulong)*(undefined8 *)(pfVar9 + -lVar14) >> 0x20);
              fVar42 = fVar31 - fVar32;
              pfVar9[1] = fVar32 + fVar31;
              *pfVar9 = fVar30 + pfVar9[-lVar14];
              *(ulong *)(pfVar9 + -lVar14) =
                   CONCAT44(fVar42 * fVar28 + -fVar41 * fVar29,fVar41 * fVar28 + fVar42 * fVar29);
              fVar30 = (float)*(undefined8 *)(pfVar9 + -2);
              fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -2) >> 0x20);
              fVar41 = fVar30 - (float)*(undefined8 *)(pfVar9 + (-2 - lVar14));
              fVar32 = (float)((ulong)*(undefined8 *)(pfVar9 + (-2 - lVar14)) >> 0x20);
              fVar42 = fVar31 - fVar32;
              pfVar9[-1] = fVar32 + fVar31;
              pfVar9[-2] = fVar30 + pfVar9[-2 - lVar14];
              *(ulong *)(pfVar9 + (-2 - lVar14)) =
                   CONCAT44(fVar42 * fVar36 + -fVar41 * fVar27,fVar41 * fVar36 + fVar42 * fVar27);
              fVar30 = (float)*(undefined8 *)(pfVar9 + -4);
              fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -4) >> 0x20);
              fVar41 = fVar30 - (float)*(undefined8 *)(pfVar9 + (-4 - lVar14));
              fVar32 = (float)((ulong)*(undefined8 *)(pfVar9 + (-4 - lVar14)) >> 0x20);
              fVar42 = fVar31 - fVar32;
              pfVar9[-3] = fVar32 + fVar31;
              pfVar9[-4] = fVar30 + pfVar9[-4 - lVar14];
              *(ulong *)(pfVar9 + (-4 - lVar14)) =
                   CONCAT44(fVar42 * fVar23 + -fVar41 * fVar26,fVar41 * fVar23 + fVar42 * fVar26);
              fVar30 = (float)*(undefined8 *)(pfVar9 + -6);
              fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -6) >> 0x20);
              fVar41 = fVar30 - (float)*(undefined8 *)(pfVar9 + (-6 - lVar14));
              fVar32 = (float)((ulong)*(undefined8 *)(pfVar9 + (-6 - lVar14)) >> 0x20);
              fVar42 = fVar31 - fVar32;
              pfVar9[-5] = fVar32 + fVar31;
              pfVar9[-6] = fVar30 + pfVar9[-6 - lVar14];
              *(ulong *)(pfVar9 + (-6 - lVar14)) =
                   CONCAT44(fVar42 * fVar25 + -fVar41 * fVar24,fVar41 * fVar25 + fVar42 * fVar24);
              pfVar9 = pfVar9 + -(long)iVar5;
              uVar8 = uVar8 - 1;
            } while (1 < uVar8);
          }
          pfVar6 = pfVar6 + (0x20 << (bVar3 & 0x1f));
          pfVar7 = pfVar7 + -8;
          bVar2 = 1 < iVar21;
          iVar21 = iVar21 + -1;
        } while (bVar2);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar16);
  }
  iVar4 = (int)local_98;
  if (0 < local_74) {
    fVar25 = local_40[(int)local_58];
    pfVar6 = local_68 + iVar4;
    do {
      pfVar7 = pfVar6 + -0x10;
      fVar27 = (float)*(undefined8 *)(pfVar6 + -2);
      fVar28 = (float)((ulong)*(undefined8 *)(pfVar6 + -2) >> 0x20);
      fVar44 = (float)*(undefined8 *)(pfVar6 + -10);
      fVar24 = fVar27 - fVar44;
      fVar46 = (float)((ulong)*(undefined8 *)(pfVar6 + -10) >> 0x20);
      fVar23 = fVar28 - fVar46;
      fVar38 = (float)*(undefined8 *)(pfVar6 + -4);
      fVar37 = (float)((ulong)*(undefined8 *)(pfVar6 + -4) >> 0x20);
      fVar36 = (float)*(undefined8 *)(pfVar6 + -0xc);
      fVar31 = fVar38 + fVar36;
      fVar35 = (float)((ulong)*(undefined8 *)(pfVar6 + -0xc) >> 0x20);
      fVar32 = fVar37 + fVar35;
      fVar48 = (float)*(undefined8 *)(pfVar6 + -0xe);
      fVar45 = (float)((ulong)*(undefined8 *)(pfVar6 + -0xe) >> 0x20);
      fVar47 = (float)*(undefined8 *)(pfVar6 + -6);
      fVar41 = fVar48 + fVar47;
      fVar49 = (float)((ulong)*(undefined8 *)(pfVar6 + -6) >> 0x20);
      fVar42 = fVar45 + fVar49;
      fVar40 = (float)*(undefined8 *)(pfVar6 + -8);
      fVar43 = (float)((ulong)*(undefined8 *)(pfVar6 + -8) >> 0x20);
      fVar26 = (float)*(undefined8 *)pfVar7;
      fVar33 = fVar40 + fVar26;
      fVar39 = (float)((ulong)*(undefined8 *)pfVar7 >> 0x20);
      fVar34 = fVar43 + fVar39;
      fVar29 = fVar31 - fVar33;
      fVar30 = fVar32 - fVar34;
      fVar27 = fVar27 + fVar44;
      fVar28 = fVar28 + fVar46;
      fVar45 = fVar45 - fVar49;
      fVar47 = fVar47 - fVar48;
      fVar37 = fVar37 - fVar35;
      fVar38 = fVar38 - fVar36;
      fVar39 = fVar39 - fVar43;
      fVar40 = fVar40 - fVar26;
      fVar36 = (fVar37 + fVar38) * fVar25;
      fVar26 = (fVar38 - fVar37) * fVar25;
      fVar38 = (fVar39 - fVar40) * fVar25;
      fVar37 = (fVar40 + fVar39) * fVar25;
      fVar39 = fVar27 - fVar41;
      fVar35 = fVar28 - fVar42;
      fVar33 = fVar33 + fVar31;
      fVar34 = fVar34 + fVar32;
      fVar27 = fVar27 + fVar41;
      fVar28 = fVar28 + fVar42;
      pfVar6[-4] = fVar27 - fVar33;
      pfVar6[-3] = fVar28 - fVar34;
      pfVar6[-2] = fVar27 + fVar33;
      pfVar6[-1] = fVar28 + fVar34;
      pfVar6[-8] = fVar39 + fVar30;
      pfVar6[-7] = fVar35 - fVar29;
      pfVar6[-6] = fVar39 - fVar30;
      pfVar6[-5] = fVar35 + fVar29;
      fVar27 = fVar36 - fVar37;
      fVar28 = fVar26 - fVar38;
      fVar26 = fVar26 + fVar38;
      fVar36 = fVar36 + fVar37;
      *(ulong *)(pfVar6 + -10) = CONCAT44(fVar36 + fVar23 + fVar47,fVar26 + fVar24 + fVar45);
      pfVar6[-0xe] = (fVar24 - fVar45) - fVar27;
      pfVar6[-0xd] = (fVar23 - fVar47) + fVar28;
      pfVar6[-0xc] = (fVar45 + fVar24) - fVar26;
      pfVar6[-0xb] = (fVar47 + fVar23) - fVar36;
      *(ulong *)pfVar7 = CONCAT44((fVar23 - fVar47) - fVar28,(fVar24 - fVar45) + fVar27);
      pfVar9 = pfVar6 + -0x11;
      pfVar6 = pfVar7;
    } while (local_68 + (long)local_4c + (long)(local_74 * -0x10) < pfVar9);
  }
  if (3 < (int)local_90) {
    pfVar6 = local_b0 + ((int)local_90 - 4);
    puVar10 = local_b8->bit_reverse[local_a8];
    pfVar7 = local_b0 + (long)iVar4 + -1;
    do {
      uVar19 = (ulong)*puVar10;
      *pfVar7 = local_68[uVar19];
      pfVar7[-1] = local_68[uVar19 + 1];
      pfVar6[3] = local_68[uVar19 + 2];
      pfVar6[2] = local_68[uVar19 + 3];
      uVar19 = (ulong)puVar10[1];
      pfVar7[-2] = local_68[uVar19];
      pfVar7[-3] = local_68[uVar19 + 1];
      pfVar6[1] = local_68[uVar19 + 2];
      *pfVar6 = local_68[uVar19 + 3];
      pfVar6 = pfVar6 + -4;
      puVar10 = puVar10 + 2;
      pfVar7 = pfVar7 + -4;
    } while (local_b0 <= pfVar6);
  }
  pfVar6 = local_b0 + local_88 + -4;
  if (local_b0 < pfVar6) {
    pfVar7 = local_b8->C[local_a8];
    lVar14 = 0;
    do {
      fVar25 = *(float *)((long)pfVar7 + lVar14 + 4);
      puVar1 = (undefined8 *)((long)local_b0 + lVar14);
      fVar23 = (float)*puVar1;
      fVar26 = (float)((ulong)*puVar1 >> 0x20);
      fVar24 = (float)*(undefined8 *)(pfVar6 + 2);
      fVar36 = fVar23 - fVar24;
      fVar28 = (float)((ulong)*(undefined8 *)(pfVar6 + 2) >> 0x20);
      fVar27 = fVar26 - fVar28;
      fVar23 = fVar23 + fVar24;
      fVar26 = fVar26 + fVar28;
      fVar24 = fVar25 * fVar36 + *(float *)((long)pfVar7 + lVar14) * fVar26;
      fVar25 = fVar25 * fVar26 + -*(float *)((long)pfVar7 + lVar14) * fVar36;
      *puVar1 = CONCAT44(fVar27 + fVar25,fVar23 + fVar24);
      *(ulong *)(pfVar6 + 2) = CONCAT44(fVar25 - fVar27,fVar23 - fVar24);
      fVar25 = *(float *)((long)pfVar7 + lVar14 + 8);
      fVar24 = *(float *)((long)pfVar7 + lVar14 + 0xc);
      fVar23 = (float)*(undefined8 *)pfVar6;
      fVar27 = (float)((ulong)*(undefined8 *)pfVar6 >> 0x20);
      fVar26 = (float)puVar1[1];
      fVar36 = (float)((ulong)puVar1[1] >> 0x20);
      fVar28 = fVar26 - fVar23;
      fVar29 = fVar36 - fVar27;
      fVar26 = fVar26 + fVar23;
      fVar36 = fVar36 + fVar27;
      fVar23 = fVar24 * fVar28 + fVar25 * fVar36;
      fVar25 = fVar24 * fVar36 + -fVar25 * fVar28;
      puVar1[1] = CONCAT44(fVar29 + fVar25,fVar26 + fVar23);
      *pfVar6 = fVar26 - fVar23;
      pfVar6[1] = fVar25 - fVar29;
      pfVar6 = pfVar6 + -4;
      lVar14 = lVar14 + 0x10;
    } while (puVar1 + 2 < pfVar6);
  }
  if (local_b0 <= local_b0 + local_88 + -8) {
    lVar14 = (long)(int)local_34;
    pfVar6 = local_b0 + -1;
    pfVar11 = local_b8->B[local_a8] + -1;
    pfVar7 = local_68 + -1;
    local_68 = local_68 + 3;
    pfVar9 = local_b0;
    do {
      pfVar9 = pfVar9 + -8;
      fVar24 = pfVar6[local_88 + -1] * pfVar11[local_88] - pfVar11[local_88 + -1] * pfVar6[local_88]
      ;
      fVar25 = -pfVar6[local_88 + -1] * pfVar11[local_88 + -1] -
               pfVar11[local_88] * pfVar6[local_88];
      local_68[-3] = fVar24;
      pfVar7[iVar4] = -fVar24;
      local_68[local_88 + -3] = fVar25;
      pfVar7[lVar14] = fVar25;
      fVar24 = pfVar6[local_88 + -3] * pfVar11[local_88 + -2] -
               pfVar11[local_88 + -3] * pfVar6[local_88 + -2];
      fVar25 = -pfVar6[local_88 + -3] * pfVar11[local_88 + -3] -
               pfVar11[local_88 + -2] * pfVar6[local_88 + -2];
      local_68[-2] = fVar24;
      pfVar7[(long)iVar4 + -1] = -fVar24;
      local_68[local_88 + -2] = fVar25;
      pfVar7[lVar14 + -1] = fVar25;
      fVar24 = pfVar6[local_88 + -5] * pfVar11[local_88 + -4] -
               pfVar11[local_88 + -5] * pfVar6[local_88 + -4];
      fVar25 = -pfVar6[local_88 + -5] * pfVar11[local_88 + -5] -
               pfVar11[local_88 + -4] * pfVar6[local_88 + -4];
      local_68[-1] = fVar24;
      pfVar7[(long)iVar4 + -2] = -fVar24;
      local_68[local_88 + -1] = fVar25;
      pfVar7[lVar14 + -2] = fVar25;
      fVar24 = pfVar6[local_88 + -7] * pfVar11[local_88 + -6] -
               pfVar11[local_88 + -7] * pfVar6[local_88 + -6];
      fVar25 = -pfVar6[local_88 + -7] * pfVar11[local_88 + -7] -
               pfVar11[local_88 + -6] * pfVar6[local_88 + -6];
      *local_68 = fVar24;
      pfVar7[(long)iVar4 + -3] = -fVar24;
      local_68[local_88] = fVar25;
      pfVar7[lVar14 + -3] = fVar25;
      pfVar6 = pfVar6 + -8;
      pfVar11 = pfVar11 + -8;
      pfVar7 = pfVar7 + -4;
      local_68 = local_68 + 4;
    } while (local_b0 <= pfVar9 + local_88 + -8);
  }
  local_b8->temp_offset = local_78;
  return;
}

Assistant:

static void inverse_mdct(float *buffer, int n, vorb *f, int blocktype)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3, l;
   int ld;
   // @OPTIMIZE: reduce register pressure by using fewer variables?
   int save_point = temp_alloc_save(f);
   float *buf2 = (float *) temp_alloc(f, n2 * sizeof(*buf2));
   float *u=NULL,*v=NULL;
   // twiddle factors
   float *A = f->A[blocktype];

   // IMDCT algorithm from "The use of multirate filter banks for coding of high quality digital audio"
   // See notes about bugs in that paper in less-optimal implementation 'inverse_mdct_old' after this function.

   // kernel from paper


   // merged:
   //   copy and reflect spectral data
   //   step 0

   // note that it turns out that the items added together during
   // this step are, in fact, being added to themselves (as reflected
   // by step 0). inexplicable inefficiency! this became obvious
   // once I combined the passes.

   // so there's a missing 'times 2' here (for adding X to itself).
   // this propagates through linearly to the end, where the numbers
   // are 1/2 too small, and need to be compensated for.

   {
      float *d,*e, *AA, *e_stop;
      d = &buf2[n2-2];
      AA = A;
      e = &buffer[0];
      e_stop = &buffer[n2];
      while (e != e_stop) {
         d[1] = (e[0] * AA[0] - e[2]*AA[1]);
         d[0] = (e[0] * AA[1] + e[2]*AA[0]);
         d -= 2;
         AA += 2;
         e += 4;
      }

      e = &buffer[n2-3];
      while (d >= buf2) {
         d[1] = (-e[2] * AA[0] - -e[0]*AA[1]);
         d[0] = (-e[2] * AA[1] + -e[0]*AA[0]);
         d -= 2;
         AA += 2;
         e -= 4;
      }
   }

   // now we use symbolic names for these, so that we can
   // possibly swap their meaning as we change which operations
   // are in place

   u = buffer;
   v = buf2;

   // step 2    (paper output is w, now u)
   // this could be in place, but the data ends up in the wrong
   // place... _somebody_'s got to swap it, so this is nominated
   {
      float *AA = &A[n2-8];
      float *d0,*d1, *e0, *e1;

      e0 = &v[n4];
      e1 = &v[0];

      d0 = &u[n4];
      d1 = &u[0];

      while (AA >= A) {
         float v40_20, v41_21;

         v41_21 = e0[1] - e1[1];
         v40_20 = e0[0] - e1[0];
         d0[1]  = e0[1] + e1[1];
         d0[0]  = e0[0] + e1[0];
         d1[1]  = v41_21*AA[4] - v40_20*AA[5];
         d1[0]  = v40_20*AA[4] + v41_21*AA[5];

         v41_21 = e0[3] - e1[3];
         v40_20 = e0[2] - e1[2];
         d0[3]  = e0[3] + e1[3];
         d0[2]  = e0[2] + e1[2];
         d1[3]  = v41_21*AA[0] - v40_20*AA[1];
         d1[2]  = v40_20*AA[0] + v41_21*AA[1];

         AA -= 8;

         d0 += 4;
         d1 += 4;
         e0 += 4;
         e1 += 4;
      }
   }

   // step 3
   ld = ilog(n) - 1; // ilog is off-by-one from normal definitions

   // optimized step 3:

   // the original step3 loop can be nested r inside s or s inside r;
   // it's written originally as s inside r, but this is dumb when r
   // iterates many times, and s few. So I have two copies of it and
   // switch between them halfway.

   // this is iteration 0 of step 3
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*0, -(n >> 3), A);
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*1, -(n >> 3), A);

   // this is iteration 1 of step 3
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*0, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*1, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*2, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*3, -(n >> 4), A, 16);

   l=2;
   for (; l < (ld-3)>>1; ++l) {
      int k0 = n >> (l+2), k0_2 = k0>>1;
      int lim = 1 << (l+1);
      int i;
      for (i=0; i < lim; ++i)
         imdct_step3_inner_r_loop(n >> (l+4), u, n2-1 - k0*i, -k0_2, A, 1 << (l+3));
   }

   for (; l < ld-6; ++l) {
      int k0 = n >> (l+2), k1 = 1 << (l+3), k0_2 = k0>>1;
      int rlim = n >> (l+6), r;
      int lim = 1 << (l+1);
      int i_off;
      float *A0 = A;
      i_off = n2-1;
      for (r=rlim; r > 0; --r) {
         imdct_step3_inner_s_loop(lim, u, i_off, -k0_2, A0, k1, k0);
         A0 += k1*4;
         i_off -= 8;
      }
   }

   // iterations with count:
   //   ld-6,-5,-4 all interleaved together
   //       the big win comes from getting rid of needless flops
   //         due to the constants on pass 5 & 4 being all 1 and 0;
   //       combining them to be simultaneous to improve cache made little difference
   imdct_step3_inner_s_loop_ld654(n >> 5, u, n2-1, A, n);

   // output is u

   // step 4, 5, and 6
   // cannot be in-place because of step 5
   {
      uint16 *bitrev = f->bit_reverse[blocktype];
      // weirdly, I'd have thought reading sequentially and writing
      // erratically would have been better than vice-versa, but in
      // fact that's not what my testing showed. (That is, with
      // j = bitreverse(i), do you read i and write j, or read j and write i.)

      float *d0 = &v[n4-4];
      float *d1 = &v[n2-4];
      while (d0 >= v) {
         int k4;

         k4 = bitrev[0];
         d1[3] = u[k4+0];
         d1[2] = u[k4+1];
         d0[3] = u[k4+2];
         d0[2] = u[k4+3];

         k4 = bitrev[1];
         d1[1] = u[k4+0];
         d1[0] = u[k4+1];
         d0[1] = u[k4+2];
         d0[0] = u[k4+3];

         d0 -= 4;
         d1 -= 4;
         bitrev += 2;
      }
   }
   // (paper output is u, now v)


   // data must be in buf2
   assert(v == buf2);

   // step 7   (paper output is v, now v)
   // this is now in place
   {
      float *C = f->C[blocktype];
      float *d, *e;

      d = v;
      e = v + n2 - 4;

      while (d < e) {
         float a02,a11,b0,b1,b2,b3;

         a02 = d[0] - e[2];
         a11 = d[1] + e[3];

         b0 = C[1]*a02 + C[0]*a11;
         b1 = C[1]*a11 - C[0]*a02;

         b2 = d[0] + e[ 2];
         b3 = d[1] - e[ 3];

         d[0] = b2 + b0;
         d[1] = b3 + b1;
         e[2] = b2 - b0;
         e[3] = b1 - b3;

         a02 = d[2] - e[0];
         a11 = d[3] + e[1];

         b0 = C[3]*a02 + C[2]*a11;
         b1 = C[3]*a11 - C[2]*a02;

         b2 = d[2] + e[ 0];
         b3 = d[3] - e[ 1];

         d[2] = b2 + b0;
         d[3] = b3 + b1;
         e[0] = b2 - b0;
         e[1] = b1 - b3;

         C += 4;
         d += 4;
         e -= 4;
      }
   }

   // data must be in buf2


   // step 8+decode   (paper output is X, now buffer)
   // this generates pairs of data a la 8 and pushes them directly through
   // the decode kernel (pushing rather than pulling) to avoid having
   // to make another pass later

   // this cannot POSSIBLY be in place, so we refer to the buffers directly

   {
      float *d0,*d1,*d2,*d3;

      float *B = f->B[blocktype] + n2 - 8;
      float *e = buf2 + n2 - 8;
      d0 = &buffer[0];
      d1 = &buffer[n2-4];
      d2 = &buffer[n2];
      d3 = &buffer[n-4];
      while (e >= v) {
         float p0,p1,p2,p3;

         p3 =  e[6]*B[7] - e[7]*B[6];
         p2 = -e[6]*B[6] - e[7]*B[7];

         d0[0] =   p3;
         d1[3] = - p3;
         d2[0] =   p2;
         d3[3] =   p2;

         p1 =  e[4]*B[5] - e[5]*B[4];
         p0 = -e[4]*B[4] - e[5]*B[5];

         d0[1] =   p1;
         d1[2] = - p1;
         d2[1] =   p0;
         d3[2] =   p0;

         p3 =  e[2]*B[3] - e[3]*B[2];
         p2 = -e[2]*B[2] - e[3]*B[3];

         d0[2] =   p3;
         d1[1] = - p3;
         d2[2] =   p2;
         d3[1] =   p2;

         p1 =  e[0]*B[1] - e[1]*B[0];
         p0 = -e[0]*B[0] - e[1]*B[1];

         d0[3] =   p1;
         d1[0] = - p1;
         d2[3] =   p0;
         d3[0] =   p0;

         B -= 8;
         e -= 8;
         d0 += 4;
         d2 += 4;
         d1 -= 4;
         d3 -= 4;
      }
   }

   temp_free(f,buf2);
   temp_alloc_restore(f,save_point);
}